

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

string * __thiscall
cmGlobalNinjaGenerator::ninjaCmd_abi_cxx11_
          (string *__return_storage_ptr__,cmGlobalNinjaGenerator *this)

{
  const_reference ppcVar1;
  cmOutputConverter *this_00;
  cmMakefile *this_01;
  char *pcVar2;
  allocator local_76;
  allocator local_75 [20];
  allocator local_61;
  string local_60;
  string local_40;
  cmLocalGenerator *local_20;
  cmLocalGenerator *lgen;
  cmGlobalNinjaGenerator *this_local;
  
  lgen = (cmLocalGenerator *)this;
  this_local = (cmGlobalNinjaGenerator *)__return_storage_ptr__;
  ppcVar1 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                      (&(this->super_cmGlobalGenerator).LocalGenerators,0);
  local_20 = *ppcVar1;
  if (local_20 == (cmLocalGenerator *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"ninja",&local_76);
    std::allocator<char>::~allocator((allocator<char> *)&local_76);
  }
  else {
    this_00 = &local_20->super_cmOutputConverter;
    this_01 = cmLocalGenerator::GetMakefile(local_20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_60,"CMAKE_MAKE_PROGRAM",&local_61);
    pcVar2 = cmMakefile::GetRequiredDefinition(this_01,&local_60);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,pcVar2,local_75);
    cmOutputConverter::ConvertToOutputFormat(__return_storage_ptr__,this_00,&local_40,SHELL);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)local_75);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalNinjaGenerator::ninjaCmd() const
{
  cmLocalGenerator* lgen = this->LocalGenerators[0];
  if (lgen) {
    return lgen->ConvertToOutputFormat(
             lgen->GetMakefile()->GetRequiredDefinition("CMAKE_MAKE_PROGRAM"),
                                    cmLocalGenerator::SHELL);
  }
  return "ninja";
}